

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

void __thiscall
ON_Internal_ExtrudedVertex::UndoAttachUnmarkedFacesToCopiedVertex(ON_Internal_ExtrudedVertex *this)

{
  unsigned_short *puVar1;
  ON_SubDFace *pOVar2;
  ulong uVar3;
  ON_SubDVertex *pOVar4;
  
  if (((this->m_copied_vertex != (ON_SubDVertex *)0x0) && (this->m_copied_vertex->m_face_count != 0)
      ) && (this->m_original_vertex != (ON_SubDVertex *)0x0)) {
    pOVar4 = this->m_copied_vertex;
    if (pOVar4->m_face_count != 0) {
      uVar3 = 0;
      do {
        pOVar2 = pOVar4->m_faces[uVar3];
        if (pOVar2 != (ON_SubDFace *)0x0) {
          pOVar4->m_faces[uVar3] = (ON_SubDFace *)0x0;
          pOVar4 = this->m_original_vertex;
          if (pOVar4->m_face_count < pOVar4->m_face_capacity) {
            pOVar4->m_faces[pOVar4->m_face_count] = pOVar2;
            puVar1 = &this->m_original_vertex->m_face_count;
            *puVar1 = *puVar1 + 1;
          }
        }
        uVar3 = uVar3 + 1;
        pOVar4 = this->m_copied_vertex;
      } while (uVar3 < pOVar4->m_face_count);
    }
    pOVar4->m_face_count = 0;
  }
  return;
}

Assistant:

void UndoAttachUnmarkedFacesToCopiedVertex()
  {
    // This is used to resort the subd to a somewhat valid state after a critical error occurs
    if (nullptr == m_copied_vertex)
      return;
    if (0 == m_copied_vertex->m_face_count)
      return;
    if (nullptr == m_original_vertex)
      return;
    // Move faces from m_copied_vertex back to m_original_vertex (which is where they started).
    for (unsigned short vfi = 0; vfi < m_copied_vertex->m_face_count; vfi++)
    {
      const ON_SubDFace* f = m_copied_vertex->m_faces[vfi];
      if (nullptr == f)
        continue;
      m_copied_vertex->m_faces[vfi] = nullptr;
      if (m_original_vertex->m_face_count < m_original_vertex->m_face_capacity)
      {
        m_original_vertex->m_faces[m_original_vertex->m_face_count] = f;
        m_original_vertex->m_face_count++;
      }
    }
    m_copied_vertex->m_face_count = 0;
  }